

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void Imf_3_3::anon_unknown_1::clearCompressionRecord(Header *hdr)

{
  bool bVar1;
  iterator __position;
  undefined8 in_RDI;
  iterator i;
  lock_guard<std::mutex> lk;
  CompressionStash *s;
  map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
  *in_stack_ffffffffffffff98;
  map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
  *in_stack_ffffffffffffffa0;
  _Self local_40 [3];
  undefined8 local_28;
  _Self local_20 [2];
  CompressionStash *local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_10 = getStash();
  if (local_10 != (CompressionStash *)0x0) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffffa0,
               (mutex_type *)in_stack_ffffffffffffff98);
    local_28 = local_8;
    __position = std::
                 map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
                 ::find(in_stack_ffffffffffffff98,(key_type *)0x122feb);
    local_20[0]._M_node = __position._M_node;
    local_40[0]._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(local_20,local_40);
    if (bVar1) {
      std::
      map<void_const*,Imf_3_3::(anonymous_namespace)::CompressionRecord,std::less<void_const*>,std::allocator<std::pair<void_const*const,Imf_3_3::(anonymous_namespace)::CompressionRecord>>>
      ::erase_abi_cxx11_(in_stack_ffffffffffffffa0,__position);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x123078);
  }
  return;
}

Assistant:

static void
clearCompressionRecord (Header* hdr)
{
    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        auto i = s->_store.find (hdr);
        if (i != s->_store.end ()) s->_store.erase (i);
    }
}